

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O3

void __thiscall cmCTestP4::DiffParser::DiffParser(DiffParser *this,cmCTestP4 *p4,char *prefix)

{
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__DiffParser_00b18018;
  this->P4 = p4;
  this->AlreadyNotified = false;
  (this->CurrentPath)._M_dataplus._M_p = (pointer)&(this->CurrentPath).field_2;
  (this->CurrentPath)._M_string_length = 0;
  (this->CurrentPath).field_2._M_local_buf[0] = '\0';
  (this->RegexDiff).regmust = (char *)0x0;
  (this->RegexDiff).program = (char *)0x0;
  (this->RegexDiff).progsize = 0;
  memset(&this->RegexDiff,0,0x20a);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(p4->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexDiff,"^==== (.*)#[0-9]+ - (.*)");
  return;
}

Assistant:

DiffParser(cmCTestP4* p4, const char* prefix)
    : P4(p4)
  {
    this->SetLog(&this->P4->Log, prefix);
    this->RegexDiff.compile("^==== (.*)#[0-9]+ - (.*)");
  }